

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O0

int el_from_spsr(uint32_t spsr)

{
  uint32_t uVar1;
  uint32_t local_c;
  uint32_t spsr_local;
  
  if ((spsr & 0x10) == 0) {
    uVar1 = extract32(spsr,1,1);
    if (uVar1 == 0) {
      uVar1 = extract32(spsr,0,4);
      if (uVar1 == 1) {
        local_c = 0xffffffff;
      }
      else {
        local_c = extract32(spsr,2,2);
      }
    }
    else {
      local_c = 0xffffffff;
    }
  }
  else {
    switch(spsr & 0x1f) {
    case 0x10:
      local_c = 0;
      break;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x17:
    case 0x1b:
    case 0x1f:
      local_c = 1;
      break;
    case 0x16:
    default:
      local_c = 0xffffffff;
      break;
    case 0x1a:
      local_c = 2;
    }
  }
  return local_c;
}

Assistant:

static int el_from_spsr(uint32_t spsr)
{
    /* Return the exception level that this SPSR is requesting a return to,
     * or -1 if it is invalid (an illegal return)
     */
    if (spsr & PSTATE_nRW) {
        switch (spsr & CPSR_M) {
        case ARM_CPU_MODE_USR:
            return 0;
        case ARM_CPU_MODE_HYP:
            return 2;
        case ARM_CPU_MODE_FIQ:
        case ARM_CPU_MODE_IRQ:
        case ARM_CPU_MODE_SVC:
        case ARM_CPU_MODE_ABT:
        case ARM_CPU_MODE_UND:
        case ARM_CPU_MODE_SYS:
            return 1;
        case ARM_CPU_MODE_MON:
            /* Returning to Mon from AArch64 is never possible,
             * so this is an illegal return.
             */
        default:
            return -1;
        }
    } else {
        if (extract32(spsr, 1, 1)) {
            /* Return with reserved M[1] bit set */
            return -1;
        }
        if (extract32(spsr, 0, 4) == 1) {
            /* return to EL0 with M[0] bit set */
            return -1;
        }
        return extract32(spsr, 2, 2);
    }
}